

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

void icu_63::MessageImpl::appendReducedApostrophes
               (UnicodeString *s,int32_t start,int32_t limit,UnicodeString *sb)

{
  short sVar1;
  int32_t iVar2;
  undefined8 in_RAX;
  int iVar3;
  int start_00;
  int iVar4;
  int iVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    iVar5 = -1;
    while( true ) {
      sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (start < 0) {
        iVar4 = (s->fUnion).fFields.fLength;
        start_00 = 0;
      }
      else {
        iVar4 = (s->fUnion).fFields.fLength;
        start_00 = (int)sVar1 >> 5;
        if (sVar1 < 0) {
          start_00 = iVar4;
        }
        if (start <= start_00) {
          start_00 = start;
        }
      }
      iVar3 = (int)sVar1 >> 5;
      if (sVar1 < 0) {
        iVar3 = iVar4;
      }
      iVar2 = UnicodeString::doIndexOf(s,L'\'',start_00,iVar3 - start_00);
      if ((iVar2 < 0) || (limit <= iVar2)) {
        UnicodeString::doAppend(sb,s,start,limit - start);
        return;
      }
      if (iVar2 == iVar5) break;
      UnicodeString::doAppend(sb,s,start,iVar2 - start);
      iVar5 = iVar2 + 1;
      start = iVar5;
    }
    uStack_38 = CONCAT26(0x27,(undefined6)uStack_38);
    UnicodeString::doAppend(sb,(UChar *)((long)&uStack_38 + 6),0,1);
    start = start + 1;
  } while( true );
}

Assistant:

void
MessageImpl::appendReducedApostrophes(const UnicodeString &s, int32_t start, int32_t limit,
                                      UnicodeString &sb) {
    int32_t doubleApos=-1;
    for(;;) {
        int32_t i=s.indexOf(u_apos, start);
        if(i<0 || i>=limit) {
            sb.append(s, start, limit-start);
            break;
        }
        if(i==doubleApos) {
            // Double apostrophe at start-1 and start==i, append one.
            sb.append(u_apos);
            ++start;
            doubleApos=-1;
        } else {
            // Append text between apostrophes and skip this one.
            sb.append(s, start, i-start);
            doubleApos=start=i+1;
        }
    }
}